

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_difference_64(void **param_1)

{
  bool bVar1;
  Roaring64Map *rhs;
  Roaring64Map *lhs;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> two_maps;
  undefined4 in_stack_fffffffffffffefc;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> *this;
  char *in_stack_ffffffffffffff08;
  unsigned_long in_stack_ffffffffffffff10;
  Roaring64Map *in_stack_ffffffffffffffb8;
  
  this = (pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> *)&stack0xffffffffffffff28;
  make_two_big_roaring64_maps();
  doublechecked::Roaring64Map::operator-=(&this->first,(Roaring64Map *)&stack0xffffffffffffff90);
  bVar1 = doublechecked::Roaring64Map::does_std_set_match_roaring(in_stack_ffffffffffffffb8);
  _assert_true(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(char *)this,
               CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc));
  std::pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map>::~pair(this);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_difference_64) {
    auto two_maps = make_two_big_roaring64_maps();

    auto &lhs = two_maps.first;
    const auto &rhs = two_maps.second;

    lhs -= rhs;
    assert_true(lhs.does_std_set_match_roaring());
}